

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O1

int arkCheckTemporalError(ARKodeMem ark_mem,int *nflagPtr,int *nefPtr,sunrealtype dsm)

{
  ARKodeHAdaptMem hadapt_mem;
  ARKodeHAdaptMem pAVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  hadapt_mem = ark_mem->hadapt_mem;
  if (hadapt_mem == (ARKodeHAdaptMem)0x0) {
    iVar3 = -0x15;
    arkProcessError(ark_mem,-0x15,0xc33,"arkCheckTemporalError",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"Adaptivity memory structure not allocated.");
  }
  else {
    dVar4 = ark_mem->tn;
    if (dsm <= 1.0) {
      dVar4 = dVar4 + ark_mem->h;
    }
    iVar2 = arkAdapt(ark_mem,hadapt_mem,ark_mem->ycur,dVar4,ark_mem->h,dsm);
    iVar3 = -3;
    if (iVar2 == 0) {
      iVar3 = 0;
      pAVar1 = ark_mem->hadapt_mem;
      dVar4 = pAVar1->etamax;
      dVar5 = ark_mem->eta;
      if (dVar4 <= ark_mem->eta) {
        dVar5 = dVar4;
      }
      dVar4 = ark_mem->hmin / ABS(ark_mem->h);
      if (dVar5 <= dVar4) {
        dVar5 = dVar4;
      }
      dVar7 = ark_mem->hmax_inv * ABS(ark_mem->h);
      dVar8 = dVar7 * dVar5;
      dVar6 = 1.0;
      if (1.0 <= dVar8) {
        dVar6 = dVar8;
      }
      dVar5 = dVar5 / dVar6;
      ark_mem->eta = dVar5;
      if (1.0 < dsm) {
        *nefPtr = *nefPtr + 1;
        ark_mem->netf = ark_mem->netf + 1;
        *nflagPtr = 8;
        iVar2 = *nefPtr;
        iVar3 = -3;
        if (iVar2 != ark_mem->maxnef) {
          hadapt_mem->etamax = 1.0;
          if (hadapt_mem->small_nef <= iVar2) {
            if (hadapt_mem->etamxf <= dVar5) {
              dVar5 = hadapt_mem->etamxf;
            }
            ark_mem->eta = dVar5;
          }
          dVar5 = pAVar1->etamax;
          dVar6 = ark_mem->eta;
          if (dVar5 <= ark_mem->eta) {
            dVar6 = dVar5;
          }
          if (dVar6 <= dVar4) {
            dVar6 = dVar4;
          }
          dVar7 = dVar7 * dVar6;
          dVar4 = 1.0;
          if (1.0 <= dVar7) {
            dVar4 = dVar7;
          }
          ark_mem->eta = dVar6 / dVar4;
          iVar3 = 5;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int arkCheckTemporalError(ARKodeMem ark_mem, int* nflagPtr, int* nefPtr,
                          sunrealtype dsm)
{
  int retval;
  sunrealtype ttmp;
  ARKodeHAdaptMem hadapt_mem;

  /* Access hadapt_mem structure */
  if (ark_mem->hadapt_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARKADAPT_NO_MEM);
    return (ARK_MEM_NULL);
  }
  hadapt_mem = ark_mem->hadapt_mem;

  /* consider change of step size for next step attempt (may be
     larger/smaller than current step, depending on dsm) */
  ttmp   = (dsm <= ONE) ? ark_mem->tn + ark_mem->h : ark_mem->tn;
  retval = arkAdapt(ark_mem, hadapt_mem, ark_mem->ycur, ttmp, ark_mem->h, dsm);
  if (retval != ARK_SUCCESS) { return (ARK_ERR_FAILURE); }

  /* if we've made it here then no nonrecoverable failures occurred; someone above
     has recommended an 'eta' value for the next step -- enforce bounds on that value
     and set upcoming step size */
  ark_mem->eta = SUNMIN(ark_mem->eta, ark_mem->hadapt_mem->etamax);
  ark_mem->eta = SUNMAX(ark_mem->eta, ark_mem->hmin / SUNRabs(ark_mem->h));
  ark_mem->eta /=
    SUNMAX(ONE, SUNRabs(ark_mem->h) * ark_mem->hmax_inv * ark_mem->eta);

  /* If est. local error norm dsm passes test, return ARK_SUCCESS */
  if (dsm <= ONE) { return (ARK_SUCCESS); }

  /* Test failed; increment counters, set nflag */
  (*nefPtr)++;
  ark_mem->netf++;
  *nflagPtr = PREV_ERR_FAIL;

  /* At maxnef failures, return ARK_ERR_FAILURE */
  if (*nefPtr == ark_mem->maxnef) { return (ARK_ERR_FAILURE); }

  /* Set etamax=1 to prevent step size increase at end of this step */
  hadapt_mem->etamax = ONE;

  /* Enforce failure bounds on eta */
  if (*nefPtr >= hadapt_mem->small_nef)
  {
    ark_mem->eta = SUNMIN(ark_mem->eta, hadapt_mem->etamxf);
  }

  /* Enforce min/max step bounds once again due to adjustments above */
  ark_mem->eta = SUNMIN(ark_mem->eta, ark_mem->hadapt_mem->etamax);
  ark_mem->eta = SUNMAX(ark_mem->eta, ark_mem->hmin / SUNRabs(ark_mem->h));
  ark_mem->eta /=
    SUNMAX(ONE, SUNRabs(ark_mem->h) * ark_mem->hmax_inv * ark_mem->eta);

  return (TRY_AGAIN);
}